

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv2maropu.cpp
# Opt level: O2

void print(externalvector *ev)

{
  ostream *poVar1;
  size_t k;
  ulong uVar2;
  ulong pos;
  vector<unsigned_int,_std::allocator<unsigned_int>_> x;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  for (pos = 0; pos < *(ulong *)(ev + 8); pos = pos + 1) {
    FastPForLib::externalvector::get((DataType *)&local_48,ev,pos);
    for (uVar2 = 0;
        uVar2 < (ulong)((long)local_48._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_48._M_impl.super__Vector_impl_data._M_start >> 2);
        uVar2 = uVar2 + 1) {
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::operator<<(poVar1," ");
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  }
  return;
}

Assistant:

void print(externalvector &ev) {
  for (size_t i = 0; i < ev.size(); ++i) {
    vector<uint32_t> x = ev.get(i);
    for (size_t k = 0; k < x.size(); ++k)
      cout << x[k] << " ";
    cout << endl;
  }
}